

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::queryCancelOrder(Application *this)

{
  bool bVar1;
  int iVar2;
  ostream *this_00;
  void *this_01;
  allocator<char> local_9d9;
  string local_9d8 [39];
  allocator<char> local_9b1;
  string local_9b0;
  OrderCancelRequest local_990;
  OrderCancelRequest local_838;
  OrderCancelRequest local_6e0;
  OrderCancelRequest local_588;
  OrderCancelRequest local_430;
  OrderCancelRequest local_2c8;
  Message local_170 [8];
  Message cancel;
  int version;
  Application *this_local;
  
  iVar2 = queryVersion(this);
  std::operator<<((ostream *)&std::cout,"\nOrderCancelRequest\n");
  FIX::Message::Message(local_170);
  switch(iVar2) {
  case 0x28:
    queryOrderCancelRequest40(&local_2c8,this);
    FIX::Message::operator=(local_170,(Message *)&local_2c8);
    FIX40::OrderCancelRequest::~OrderCancelRequest(&local_2c8);
    break;
  case 0x29:
    queryOrderCancelRequest41(&local_430,this);
    FIX::Message::operator=(local_170,(Message *)&local_430);
    FIX41::OrderCancelRequest::~OrderCancelRequest(&local_430);
    break;
  case 0x2a:
    queryOrderCancelRequest42(&local_588,this);
    FIX::Message::operator=(local_170,(Message *)&local_588);
    FIX42::OrderCancelRequest::~OrderCancelRequest(&local_588);
    break;
  case 0x2b:
    queryOrderCancelRequest43(&local_6e0,this);
    FIX::Message::operator=(local_170,(Message *)&local_6e0);
    FIX43::OrderCancelRequest::~OrderCancelRequest(&local_6e0);
    break;
  case 0x2c:
    queryOrderCancelRequest44(&local_838,this);
    FIX::Message::operator=(local_170,(Message *)&local_838);
    FIX44::OrderCancelRequest::~OrderCancelRequest(&local_838);
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,"No test for version ");
    this_01 = (void *)std::ostream::operator<<(this_00,iVar2);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    break;
  case 0x32:
    queryOrderCancelRequest50(&local_990,this);
    FIX::Message::operator=(local_170,(Message *)&local_990);
    FIX50::OrderCancelRequest::~OrderCancelRequest(&local_990);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"Send cancel",&local_9b1);
  bVar1 = queryConfirm(this,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_9d8,"",&local_9d9);
    FIX::Session::sendToTarget(local_170,local_9d8);
    std::__cxx11::string::~string(local_9d8);
    std::allocator<char>::~allocator(&local_9d9);
  }
  FIX::Message::~Message(local_170);
  return;
}

Assistant:

void Application::queryCancelOrder() {
  int version = queryVersion();
  std::cout << "\nOrderCancelRequest\n";
  FIX::Message cancel;

  switch (version) {
  case 40:
    cancel = queryOrderCancelRequest40();
    break;
  case 41:
    cancel = queryOrderCancelRequest41();
    break;
  case 42:
    cancel = queryOrderCancelRequest42();
    break;
  case 43:
    cancel = queryOrderCancelRequest43();
    break;
  case 44:
    cancel = queryOrderCancelRequest44();
    break;
  case 50:
    cancel = queryOrderCancelRequest50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send cancel")) {
    FIX::Session::sendToTarget(cancel);
  }
}